

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

StatisticObject Clasp::StatisticObject::fromRep(uint64 x)

{
  I *pIVar1;
  void *pvVar2;
  uint64 in_RDI;
  StatisticObject *unaff_retaddr;
  StatisticObject r;
  StatisticObject local_8;
  
  if (in_RDI == 0) {
    StatisticObject(&local_8,(void *)0x0,0);
  }
  else {
    StatisticObject(&local_8);
    local_8.handle_ = in_RDI;
    pIVar1 = tid((StatisticObject *)0x206c71);
    if ((pIVar1 == (I *)0x0) || (pvVar2 = self(unaff_retaddr), ((ulong)pvVar2 & 3) != 0)) {
      Potassco::fail(-2,"static StatisticObject Clasp::StatisticObject::fromRep(uint64)",99,
                     "r.tid() != 0 && (reinterpret_cast<uintp>(r.self()) & 3u) == 0","invalid key",0
                    );
    }
  }
  return (StatisticObject)local_8.handle_;
}

Assistant:

StatisticObject StatisticObject::fromRep(uint64 x) {
	if (!x) { return StatisticObject(0, 0); }
	StatisticObject r;
	r.handle_ = x;
	POTASSCO_REQUIRE(r.tid() != 0 && (reinterpret_cast<uintp>(r.self()) & 3u) == 0, "invalid key");
	return r;
}